

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::ConversionError::ConversionError
          (ConversionError *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *results)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_c9 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff78;
  ConversionError *in_stack_ffffffffffffff80;
  
  ::std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  ::std::operator+(in_RDX,in_stack_ffffffffffffff10);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c9;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
             (allocator<char> *)in_stack_ffffffffffffff40);
  CLI::detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)name,(string *)results);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  ConversionError(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  ::std::__cxx11::string::~string(this_00);
  ::std::__cxx11::string::~string(this_00);
  ::std::__cxx11::string::~string(this_00);
  ::std::allocator<char>::~allocator(local_c9);
  ::std::__cxx11::string::~string(this_00);
  ::std::__cxx11::string::~string(this_00);
  return;
}

Assistant:

ConversionError(std::string name, std::vector<std::string> results)
        : ConversionError("Could not convert: " + name + " = " + detail::join(results)) {}